

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

void __thiscall cm::String::internally_mutate_to_stable_string(String *this)

{
  char *d;
  size_type s;
  String local_30;
  String *local_10;
  String *this_local;
  
  local_10 = this;
  d = data(this);
  s = size(this);
  String(&local_30,d,s);
  operator=(this,&local_30);
  ~String(&local_30);
  return;
}

Assistant:

void String::internally_mutate_to_stable_string()
{
  // We assume that only one thread mutates this instance at
  // a time even if we point to a shared string buffer referenced
  // by other threads.
  *this = String(this->data(), this->size());
}